

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parachute.h
# Opt level: O0

void __thiscall Parachute::Parachute(Parachute *this)

{
  Point<double> local_1d0;
  Point<double> local_1b8;
  Point<double> local_1a0;
  Point<double> local_188;
  Point<double> local_170;
  Point<double> local_158;
  Point<double> local_140;
  Point<double> local_128;
  Point<double> local_110;
  Point<double> local_f8;
  Point<double> local_e0;
  Point<double> local_c8;
  Point<double> local_b0;
  Point<double> local_98;
  Point<double> local_80;
  Point<double> local_68;
  Point<double> local_50;
  Point<double> local_28;
  Parachute *local_10;
  Parachute *this_local;
  
  local_10 = this;
  Polygon::Polygon(&this->super_Polygon);
  Point<double>::Point(&local_28,75.0,350.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_50,25.0,400.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_68,0.0,200.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_80,50.0,150.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_98,200.0,100.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_b0,600.0,100.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_c8,750.0,150.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_e0,800.0,200.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_f8,775.0,400.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_110,725.0,350.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_128,575.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_140,550.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_158,525.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_170,550.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_188,250.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1a0,275.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1b8,250.0,600.0,0.0);
  Polygon::addPoint((Point *)this);
  Point<double>::Point(&local_1d0,225.0,300.0,0.0);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Parachute() {
    addPoint(Point<double>(75,350));
    addPoint(Point<double>(25,400));
    addPoint(Point<double>(0,200));
    addPoint(Point<double>(50,150));
    addPoint(Point<double>(200,100));
    addPoint(Point<double>(600,100));
    addPoint(Point<double>(750,150));
    addPoint(Point<double>(800,200));
    addPoint(Point<double>(775,400));
    addPoint(Point<double>(725,350));
    addPoint(Point<double>(575,300));
    addPoint(Point<double>(550,600));
    addPoint(Point<double>(525,600));
    addPoint(Point<double>(550,300));
    addPoint(Point<double>(250,300));
    addPoint(Point<double>(275,600));
    addPoint(Point<double>(250,600));
    addPoint(Point<double>(225,300));
  }